

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv__tcp_keepalive(int fd,int on,uint delay)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint local_18;
  int local_14;
  
  local_18 = delay;
  local_14 = on;
  iVar1 = setsockopt(fd,1,9,&local_14,4);
  if ((iVar1 != 0) ||
     ((iVar1 = 0, local_14 != 0 && (iVar2 = setsockopt(fd,6,4,&local_18,4), iVar2 != 0)))) {
    piVar3 = __errno_location();
    iVar1 = -*piVar3;
  }
  return iVar1;
}

Assistant:

int uv__tcp_keepalive(int fd, int on, unsigned int delay) {
  if (setsockopt(fd, SOL_SOCKET, SO_KEEPALIVE, &on, sizeof(on)))
    return -errno;

#ifdef TCP_KEEPIDLE
  if (on && setsockopt(fd, IPPROTO_TCP, TCP_KEEPIDLE, &delay, sizeof(delay)))
    return -errno;
#endif

  /* Solaris/SmartOS, if you don't support keep-alive,
   * then don't advertise it in your system headers...
   */
  /* FIXME(bnoordhuis) That's possibly because sizeof(delay) should be 1. */
#if defined(TCP_KEEPALIVE) && !defined(__sun)
  if (on && setsockopt(fd, IPPROTO_TCP, TCP_KEEPALIVE, &delay, sizeof(delay)))
    return -errno;
#endif

  return 0;
}